

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color_mode
          (ansicolor_sink<spdlog::details::console_mutex> *this,color_mode mode)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  undefined1 local_19;
  
  if (in_ESI == 0) {
    *(undefined1 *)(in_RDI + 0x1d0) = 1;
  }
  else if (in_ESI == 1) {
    bVar1 = details::os::in_terminal((FILE *)0x20cefa);
    local_19 = false;
    if (bVar1) {
      local_19 = details::os::is_color_terminal();
    }
    *(bool *)(in_RDI + 0x1d0) = local_19;
  }
  else if (in_ESI == 2) {
    *(undefined1 *)(in_RDI + 0x1d0) = 0;
  }
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color_mode(color_mode mode)
{
    switch (mode)
    {
    case color_mode::always:
        should_do_colors_ = true;
        return;
    case color_mode::automatic:
        should_do_colors_ = details::os::in_terminal(target_file_) && details::os::is_color_terminal();
        return;
    case color_mode::never:
        should_do_colors_ = false;
        return;
    }
}